

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O3

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintJson(ConvertToolPrivate *this,BamAlignment *a)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  pointer pRVar4;
  pointer pCVar5;
  ConvertToolPrivate *pCVar6;
  BamAlignment *pBVar7;
  bool bVar8;
  ostream *poVar9;
  size_t sVar10;
  ostream *poVar11;
  BadDataException *pBVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  CigarOp *op;
  pointer pCVar18;
  char *pcVar19;
  string local_90;
  ulong local_70;
  ConvertToolPrivate *local_68;
  BamAlignment *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar11 = &this->m_out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{\"name\":\"",9);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar11,(a->Name)._M_dataplus._M_p,(a->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",\"alignmentFlag\":\"",0x13);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",",2);
  iVar3 = a->RefID;
  if ((-1 < iVar3) &&
     (iVar13 = (int)((ulong)((long)(this->m_references).
                                   super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_references).
                                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
     SBORROW4(iVar3,iVar13 * -0x33333333) != iVar3 + iVar13 * 0x33333333 < 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"reference\":\"",0xd);
    pRVar4 = (this->m_references).
             super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar11,pRVar4[a->RefID].RefName._M_dataplus._M_p,
                        pRVar4[a->RefID].RefName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"position\":",0xb);
  poVar9 = (ostream *)std::ostream::operator<<(poVar11,a->Position + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",\"mapQuality\":",0xe);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  local_90._M_dataplus._M_p._0_1_ = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_90,1);
  local_68 = this;
  local_60 = a;
  if ((a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"cigar\":[",9);
    pCVar18 = (a->CigarData).
              super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar5 = (a->CigarData).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar18 != pCVar5) {
      lVar17 = 0;
      do {
        if (lVar17 != 0) {
          local_90._M_dataplus._M_p._0_1_ = 0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
        }
        local_90._M_dataplus._M_p._0_1_ = 0x22;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        local_90._M_dataplus._M_p._0_1_ = pCVar18->Type;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_90,1);
        local_90._M_dataplus._M_p._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_90,1);
        pCVar18 = pCVar18 + 1;
        lVar17 = lVar17 + -8;
      } while (pCVar18 != pCVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"],",2);
  }
  pBVar7 = local_60;
  pCVar6 = local_68;
  bVar8 = BamAlignment::IsPaired(local_60);
  if (((bVar8) && (iVar3 = pBVar7->MateRefID, -1 < iVar3)) &&
     (iVar13 = (int)((ulong)((long)(pCVar6->m_references).
                                   super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pCVar6->m_references).
                                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
     SBORROW4(iVar3,iVar13 * -0x33333333) != iVar3 + iVar13 * 0x33333333 < 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"mate\":{",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"reference\":\"",0xd);
    pRVar4 = (pCVar6->m_references).
             super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
             super__Vector_impl_data._M_start;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar11,pRVar4[pBVar7->MateRefID].RefName._M_dataplus._M_p,
                        pRVar4[pBVar7->MateRefID].RefName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"position\":",0xb);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,pBVar7->MatePosition + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",\"insertSize\":",0xe);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,pBVar7->InsertSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"},",2);
  }
  if ((pBVar7->QueryBases)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"queryBases\":\"",0xe);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar11,(pBVar7->QueryBases)._M_dataplus._M_p,
                        (pBVar7->QueryBases)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",",2);
  }
  if (((pBVar7->Qualities)._M_string_length != 0) &&
     (pcVar19 = (pBVar7->Qualities)._M_dataplus._M_p, *pcVar19 != -1)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"qualities\":[",0xd);
    std::ostream::operator<<(poVar11,*pcVar19 + -0x21);
    pcVar19 = pcVar19 + 1;
    if (pcVar19 != (pBVar7->Qualities)._M_dataplus._M_p + (pBVar7->Qualities)._M_string_length) {
      do {
        local_90._M_dataplus._M_p._0_1_ = 0x2c;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
        std::ostream::operator<<(poVar9,*pcVar19 + -0x21);
        pcVar19 = pcVar19 + 1;
      } while (pcVar19 !=
               (pBVar7->Qualities)._M_dataplus._M_p + (pBVar7->Qualities)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"],",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"filename\":\"",0xc);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar11,(pBVar7->Filename)._M_dataplus._M_p,
                      (pBVar7->Filename)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",",2);
  local_70 = (pBVar7->TagData)._M_string_length;
  if (local_70 != 0) {
    local_58 = &pBVar7->TagData;
    pcVar19 = (pBVar7->TagData)._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"tags\":{",8);
    uVar14 = 0;
LAB_00111bf1:
    if (local_70 - uVar14 < 4) {
      pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Incomplete tag data","");
      BadDataException::BadDataException(pBVar12,&local_90);
      __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
    }
    if (uVar14 != 0) {
      local_90._M_dataplus._M_p._0_1_ = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
    }
    local_90._M_dataplus._M_p._0_1_ = 0x22;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_58);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\":",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((local_60->TagData)._M_string_length <= uVar14 + 2) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    bVar1 = (local_58->_M_dataplus)._M_p[uVar14 + 2];
    lVar17 = uVar14 + 3;
    if (bVar1 < 0x53) {
      switch(bVar1) {
      case 0x41:
        local_90._M_dataplus._M_p._0_1_ = 0x22;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
        local_90._M_dataplus._M_p._0_1_ = pcVar19[uVar14 + 3];
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_90,1);
        local_90._M_dataplus._M_p._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_90,1);
        break;
      case 0x42:
        local_90._M_dataplus._M_p._0_1_ = 0x5b;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
        sVar10 = PrintBArrayValues(local_68,pcVar19 + lVar17,local_70 - lVar17);
        uVar14 = sVar10 + lVar17;
        local_90._M_dataplus._M_p._0_1_ = 0x5d;
        goto LAB_00111e14;
      case 0x43:
        uVar15 = (uint)(byte)pcVar19[uVar14 + 3];
LAB_00111e2f:
        std::ostream::operator<<(poVar11,uVar15);
        break;
      default:
switchD_00111cfc_caseD_44:
        pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unknown tag type: ","")
        ;
        std::operator+(&local_90,&local_50,*pcVar19);
        BadDataException::BadDataException(pBVar12,&local_90);
        __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      case 0x48:
switchD_00111cfc_caseD_48:
        local_90._M_dataplus._M_p._0_1_ = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
        uVar14 = uVar14 + 4;
        do {
          cVar2 = pcVar19[uVar14 - 1];
          if (cVar2 == '\"') {
            lVar17 = 2;
            pcVar16 = "\\\"";
          }
          else {
            if (cVar2 == '\0') goto LAB_00111dd7;
            local_90._M_dataplus._M_p._0_1_ = cVar2;
            lVar17 = 1;
            pcVar16 = (char *)&local_90;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar16,lVar17);
          uVar14 = uVar14 + 1;
        } while( true );
      case 0x49:
        if (local_70 - lVar17 < 4) {
          pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"Incomplete tag data","");
          BadDataException::BadDataException(pBVar12,&local_90);
          __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        goto LAB_00111ecc;
      }
      uVar14 = uVar14 + 4;
    }
    else if (bVar1 < 0x66) {
      if (bVar1 != 0x53) {
        if (bVar1 == 0x5a) goto switchD_00111cfc_caseD_48;
        if (bVar1 != 99) goto switchD_00111cfc_caseD_44;
        uVar15 = (uint)pcVar19[uVar14 + 3];
        goto LAB_00111e2f;
      }
      if (local_70 - lVar17 < 2) {
        pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Incomplete tag data","");
        BadDataException::BadDataException(pBVar12,&local_90);
        __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
LAB_00111ea2:
      uVar14 = uVar14 + 5;
    }
    else {
      if (bVar1 == 0x66) {
        if (local_70 - lVar17 < 4) {
          pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"Incomplete tag data","");
          BadDataException::BadDataException(pBVar12,&local_90);
          __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        std::ostream::_M_insert<double>((double)*(float *)(pcVar19 + uVar14 + 3));
      }
      else {
        if (bVar1 != 0x69) {
          if (bVar1 != 0x73) goto switchD_00111cfc_caseD_44;
          if (local_70 - lVar17 < 2) {
            pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"Incomplete tag data","");
            BadDataException::BadDataException(pBVar12,&local_90);
            __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
          }
          std::ostream::operator<<(poVar11,*(short *)(pcVar19 + uVar14 + 3));
          goto LAB_00111ea2;
        }
        if (local_70 - lVar17 < 4) {
          pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"Incomplete tag data","");
          BadDataException::BadDataException(pBVar12,&local_90);
          __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
        }
        std::ostream::operator<<(poVar11,*(int *)(pcVar19 + uVar14 + 3));
      }
LAB_00111ecc:
      uVar14 = uVar14 + 7;
    }
    goto LAB_00111ed0;
  }
LAB_00111ef7:
  local_90._M_dataplus._M_p._0_1_ = 0x7d;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  return;
LAB_00111dd7:
  local_90._M_dataplus._M_p._0_1_ = 0x22;
LAB_00111e14:
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
LAB_00111ed0:
  if ((local_70 <= uVar14) || (pcVar19[uVar14] == '\0')) goto LAB_00111ee2;
  goto LAB_00111bf1;
LAB_00111ee2:
  local_90._M_dataplus._M_p._0_1_ = 0x7d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_90,1);
  goto LAB_00111ef7;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintJson(const BamAlignment& a)
{

    // write name & alignment flag
    m_out << "{\"name\":\"" << a.Name << "\",\"alignmentFlag\":\"" << a.AlignmentFlag << "\",";

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size())) {
        m_out << "\"reference\":\"" << m_references[a.RefID].RefName << "\",";
    }

    // write position & map quality
    m_out << "\"position\":" << a.Position + 1 << ",\"mapQuality\":" << a.MapQuality << ',';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (!cigarData.empty()) {
        m_out << "\"cigar\":[";
        std::vector<CigarOp>::const_iterator cigarBegin = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarIter = cigarBegin;
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            if (cigarIter != cigarBegin) {
                m_out << ',';
            }
            m_out << '"' << op.Length << op.Type << '"';
        }
        m_out << "],";
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        m_out << "\"mate\":{"
              << "\"reference\":\"" << m_references[a.MateRefID].RefName << "\","
              << "\"position\":" << a.MatePosition + 1 << ",\"insertSize\":" << a.InsertSize
              << "},";
    }

    // write sequence
    if (!a.QueryBases.empty()) {
        m_out << "\"queryBases\":\"" << a.QueryBases << "\",";
    }

    // write qualities
    if (!a.Qualities.empty() && a.Qualities.at(0) != (char)0xFF) {
        std::string::const_iterator s = a.Qualities.begin();
        m_out << "\"qualities\":[" << static_cast<short>(*s) - 33;
        ++s;
        for (; s != a.Qualities.end(); ++s) {
            m_out << ',' << static_cast<short>(*s) - 33;
        }
        m_out << "],";
    }

    // write alignment's source BAM file
    m_out << "\"filename\":\"" << a.Filename << "\",";

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();
    std::size_t index = 0;
    if (index < tagDataLength) {

        m_out << "\"tags\":{";

        while (index < tagDataLength) {
            // Need at least four bytes for a tag:
            //    two for name
            //    one for type
            //    at least one for value
            if (tagDataLength - index < 4) {
                throw BadDataException("Incomplete tag data");
            }

            if (index > 0) {
                m_out << ',';
            }

            // write tag name
            m_out << '"' << a.TagData.substr(index, 2) << "\":";
            index += 2;

            // get data type
            char type = a.TagData.at(index);
            ++index;
            switch (type) {
                case (Constants::BAM_TAG_TYPE_ASCII):
                    m_out << '"' << tagData[index] << '"';
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_INT8):
                    // force value into integer-type (instead of char value)
                    m_out << int(static_cast<int8_t>(tagData[index]));
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_UINT8):
                    // force value into integer-type (instead of char value)
                    m_out << int(static_cast<uint8_t>(tagData[index]));
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_INT16):
                    if (tagDataLength - index < sizeof(int16_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackSignedShort(&tagData[index]);
                    index += sizeof(int16_t);
                    break;

                case (Constants::BAM_TAG_TYPE_UINT16):
                    if (tagDataLength - index < sizeof(uint16_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackUnsignedShort(&tagData[index]);
                    index += sizeof(uint16_t);
                    break;

                case (Constants::BAM_TAG_TYPE_INT32):
                    if (tagDataLength - index < sizeof(int32_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackSignedInt(&tagData[index]);
                    index += sizeof(int32_t);
                    break;

                case (Constants::BAM_TAG_TYPE_UINT32):
                    if (tagDataLength - index < sizeof(uint32_t)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackUnsignedInt(&tagData[index]);
                    index += sizeof(uint32_t);
                    break;

                case (Constants::BAM_TAG_TYPE_FLOAT):
                    if (tagDataLength - index < sizeof(float)) {
                        throw BadDataException("Incomplete tag data");
                    }
                    m_out << BamTools::UnpackFloat(&tagData[index]);
                    index += sizeof(float);
                    break;

                case (Constants::BAM_TAG_TYPE_HEX):
                case (Constants::BAM_TAG_TYPE_STRING):
                    m_out << '"';
                    while (tagData[index]) {
                        if (tagData[index] == '\"') {
                            m_out << "\\\"";  // escape for json
                        } else {
                            m_out << tagData[index];
                        }
                        ++index;
                    }
                    m_out << '"';
                    ++index;
                    break;

                case (Constants::BAM_TAG_TYPE_ARRAY):
                    m_out << '[';
                    index += PrintBArrayValues(tagData + index, tagDataLength - index);
                    m_out << ']';
                    break;

                default:
                    throw BadDataException(std::string("Unknown tag type: ") + tagData[0]);
            }

            if (index >= tagDataLength || tagData[index] == '\0') {
                break;
            }
        }

        m_out << '}';
    }

    m_out << '}' << std::endl;
}